

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

uint Assimp::StandardShapes::MakeHexahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,
               bool polygons)

{
  uint uVar1;
  size_type sVar2;
  aiVector3t<float> aVar3;
  value_type local_190;
  aiVector3t<float> local_180;
  undefined1 local_174 [8];
  aiVector3D v7;
  aiVector3t<float> local_154;
  undefined1 local_148 [8];
  aiVector3D v6;
  float fStack_134;
  float local_130;
  aiVector3t<float> local_124;
  undefined1 local_118 [8];
  aiVector3D v5;
  float fStack_104;
  float local_100;
  aiVector3t<float> local_f4;
  undefined1 local_e8 [8];
  aiVector3D v4;
  float fStack_d4;
  float local_d0;
  aiVector3t<float> local_c4;
  undefined1 local_b8 [8];
  aiVector3D v3;
  float fStack_a4;
  float local_a0;
  aiVector3t<float> local_94;
  undefined1 local_88 [8];
  aiVector3D v2;
  float fStack_74;
  float local_70;
  aiVector3t<float> local_64;
  undefined1 local_58 [8];
  aiVector3D v1;
  float fStack_44;
  float local_40;
  aiVector3t<float> local_34;
  undefined1 local_28 [8];
  aiVector3D v0;
  ai_real length;
  bool polygons_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  
  sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,sVar2 + 0x24);
  v0.z = 0.57735026;
  aiVector3t<float>::aiVector3t(&local_34,-1.0,-1.0,-1.0);
  aVar3 = ::operator*(&local_34,0.57735026);
  local_40 = aVar3.z;
  v0.x = local_40;
  stack0xffffffffffffffb8 = aVar3._0_8_;
  local_28._0_4_ = v1.z;
  local_28._4_4_ = fStack_44;
  unique0x100007f1 = aVar3;
  aiVector3t<float>::aiVector3t(&local_64,1.0,-1.0,-1.0);
  aVar3 = ::operator*(&local_64,0.57735026);
  local_70 = aVar3.z;
  v1.x = local_70;
  stack0xffffffffffffff88 = aVar3._0_8_;
  local_58._0_4_ = v2.z;
  local_58._4_4_ = fStack_74;
  unique0x100007e5 = aVar3;
  aiVector3t<float>::aiVector3t(&local_94,1.0,1.0,-1.0);
  aVar3 = ::operator*(&local_94,0.57735026);
  local_a0 = aVar3.z;
  v2.x = local_a0;
  stack0xffffffffffffff58 = aVar3._0_8_;
  local_88._0_4_ = v3.z;
  local_88._4_4_ = fStack_a4;
  unique0x100007d9 = aVar3;
  aiVector3t<float>::aiVector3t(&local_c4,-1.0,1.0,-1.0);
  aVar3 = ::operator*(&local_c4,0.57735026);
  local_d0 = aVar3.z;
  v3.x = local_d0;
  stack0xffffffffffffff28 = aVar3._0_8_;
  local_b8._0_4_ = v4.z;
  local_b8._4_4_ = fStack_d4;
  unique0x100007cd = aVar3;
  aiVector3t<float>::aiVector3t(&local_f4,-1.0,-1.0,1.0);
  aVar3 = ::operator*(&local_f4,0.57735026);
  local_100 = aVar3.z;
  v4.x = local_100;
  stack0xfffffffffffffef8 = aVar3._0_8_;
  local_e8._0_4_ = v5.z;
  local_e8._4_4_ = fStack_104;
  unique0x100007c1 = aVar3;
  aiVector3t<float>::aiVector3t(&local_124,1.0,-1.0,1.0);
  aVar3 = ::operator*(&local_124,0.57735026);
  local_130 = aVar3.z;
  v5.x = local_130;
  stack0xfffffffffffffec8 = aVar3._0_8_;
  local_118._0_4_ = v6.z;
  local_118._4_4_ = fStack_134;
  unique0x100007b5 = aVar3;
  aiVector3t<float>::aiVector3t(&local_154,1.0,1.0,1.0);
  aVar3 = ::operator*(&local_154,0.57735026);
  v6.x = aVar3.z;
  v7._4_8_ = aVar3._0_8_;
  local_148 = (undefined1  [8])v7._4_8_;
  aiVector3t<float>::aiVector3t(&local_180,-1.0,1.0,1.0);
  aVar3 = ::operator*(&local_180,0.57735026);
  local_190._0_8_ = aVar3._0_8_;
  local_174._0_4_ = local_190.x;
  local_174._4_4_ = local_190.y;
  local_190.z = aVar3.z;
  v7.x = local_190.z;
  if (polygons) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_28);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_88);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_b8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_174);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_148);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_e8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_118);
  }
  uVar1 = 3;
  if (polygons) {
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

unsigned int StandardShapes::MakeHexahedron(std::vector<aiVector3D>& positions,
    bool polygons /*= false*/)
{
    positions.reserve(positions.size()+36);
    const ai_real length = ai_real(1.0)/ai_real(1.73205080);

    const aiVector3D v0  = aiVector3D(-1.0,-1.0,-1.0)*length;
    const aiVector3D v1  = aiVector3D(1.0,-1.0,-1.0)*length;
    const aiVector3D v2  = aiVector3D(1.0,1.0,-1.0)*length;
    const aiVector3D v3  = aiVector3D(-1.0,1.0,-1.0)*length;
    const aiVector3D v4  = aiVector3D(-1.0,-1.0,1.0)*length;
    const aiVector3D v5  = aiVector3D(1.0,-1.0,1.0)*length;
    const aiVector3D v6  = aiVector3D(1.0,1.0,1.0)*length;
    const aiVector3D v7  = aiVector3D(-1.0,1.0,1.0)*length;

    ADD_QUAD(v0,v3,v2,v1);
    ADD_QUAD(v0,v1,v5,v4);
    ADD_QUAD(v0,v4,v7,v3);
    ADD_QUAD(v6,v5,v1,v2);
    ADD_QUAD(v6,v2,v3,v7);
    ADD_QUAD(v6,v7,v4,v5);
    return (polygons ? 4 : 3);
}